

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O1

Unique<Entry<BrepLoop>_> __thiscall
anurbs::Entry<anurbs::BrepLoop>::create
          (Entry<anurbs::BrepLoop> *this,string *key,shared_ptr<anurbs::BrepLoop> *data)

{
  pointer *__ptr;
  Pointer<Attributes> attributes;
  __uniq_ptr_impl<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_> local_38;
  shared_ptr<anurbs::Attributes> local_30;
  
  new_<anurbs::Attributes>();
  std::__shared_ptr<anurbs::Attributes,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<anurbs::Attributes,std::default_delete<anurbs::Attributes>,void>
            ((__shared_ptr<anurbs::Attributes,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             (unique_ptr<anurbs::Attributes,_std::default_delete<anurbs::Attributes>_> *)&local_38);
  if (local_38._M_t.
      super__Tuple_impl<0UL,_anurbs::Attributes_*,_std::default_delete<anurbs::Attributes>_>.
      super__Head_base<0UL,_anurbs::Attributes_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_anurbs::Attributes_*,_std::default_delete<anurbs::Attributes>_>)0x0) {
    std::default_delete<anurbs::Attributes>::operator()
              ((default_delete<anurbs::Attributes> *)&local_38,
               (Attributes *)
               local_38._M_t.
               super__Tuple_impl<0UL,_anurbs::Attributes_*,_std::default_delete<anurbs::Attributes>_>
               .super__Head_base<0UL,_anurbs::Attributes_*,_false>._M_head_impl);
  }
  new_<anurbs::Entry<anurbs::BrepLoop>,std::__cxx11::string&,std::shared_ptr<anurbs::BrepLoop>&,std::shared_ptr<anurbs::Attributes>&>
            ((anurbs *)this,key,data,&local_30);
  if (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (__uniq_ptr_data<anurbs::Entry<anurbs::BrepLoop>,_std::default_delete<anurbs::Entry<anurbs::BrepLoop>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::BrepLoop>,_std::default_delete<anurbs::Entry<anurbs::BrepLoop>_>,_true,_true>
            )this;
}

Assistant:

static Unique<Entry<TData>> create(std::string key,
        std::shared_ptr<TData> data)
    {
        Pointer<Attributes> attributes = new_<Attributes>();
        return new_<Entry<TData>>(key, data, attributes);
    }